

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# to_hex_test.cxx
# Opt level: O2

void __thiscall empty_to_hex_test::test_method(empty_to_hex_test *this)

{
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_RCX;
  string output;
  string input;
  string expected;
  char *local_70;
  char *local_68;
  undefined1 *local_60;
  undefined1 *local_58;
  char *local_50;
  char *local_48;
  undefined **local_40;
  undefined1 local_38;
  undefined8 *local_30;
  char *local_28;
  
  std::__cxx11::string::string((string *)&input,"",(allocator *)&expected);
  std::__cxx11::string::string((string *)&expected,"",(allocator *)&output);
  cryptox::to_hex<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
            (&output,(cryptox *)input._M_dataplus._M_p,
             (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )(input._M_dataplus._M_p + input._M_string_length),in_RCX);
  local_50 = 
  "/workspace/llm4binary/github/license_c_cmakelists/madera[P]cryptox/tests/core/cryptox/detail/to_hex_test.cxx"
  ;
  local_48 = "";
  local_60 = &boost::unit_test::basic_cstring<char_const>::null;
  local_58 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_50,0x15);
  local_38 = 0;
  local_40 = &PTR__lazy_ostream_002b7238;
  local_30 = &boost::unit_test::lazy_ostream::inst;
  local_28 = "";
  local_70 = 
  "/workspace/llm4binary/github/license_c_cmakelists/madera[P]cryptox/tests/core/cryptox/detail/to_hex_test.cxx"
  ;
  local_68 = "";
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,std::__cxx11::string>
            (&local_40,&local_70,0x15,1,2,&output,"output",&expected,"expected");
  std::__cxx11::string::~string((string *)&output);
  std::__cxx11::string::~string((string *)&expected);
  std::__cxx11::string::~string((string *)&input);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(empty_to_hex_test) {
	const std::string input    = "";
	const std::string expected = "";

	std::string output = cryptox::to_hex(input.begin(), input.end());
	BOOST_CHECK_EQUAL(output, expected);
}